

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

dma_memory memory_allocate_dma(size_t size,_Bool require_contiguous)

{
  dma_memory dVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  void *virt;
  void *__addr;
  byte in_SIL;
  size_t in_RDI;
  char buf_4 [512];
  int err_4;
  int64_t result_4;
  char buf_3 [512];
  int err_3;
  int64_t result_3;
  void *virt_addr_1;
  char buf_2 [512];
  int err_2;
  int64_t result_2;
  char buf_1 [512];
  int err_1;
  int64_t result_1;
  int fd;
  char path [4096];
  uint32_t id;
  uint64_t iova;
  char buf [512];
  int err;
  int64_t result;
  void *virt_addr;
  undefined1 local_1ad8 [524];
  int local_18cc;
  long local_18c8;
  void *local_18c0;
  undefined1 local_18b8 [36];
  uint32_t in_stack_ffffffffffffe76c;
  void *in_stack_ffffffffffffe770;
  undefined1 local_1698 [524];
  int local_148c;
  long local_1488;
  undefined1 local_1478 [524];
  int local_126c;
  void *local_1268;
  int local_125c;
  char local_1258 [4108];
  uint32_t local_24c;
  void *local_240;
  undefined1 local_238 [516];
  int local_34;
  void *local_30;
  void *local_28;
  byte local_19;
  size_t local_18;
  void *local_10;
  uint64_t local_8;
  
  local_19 = in_SIL & 1;
  local_18 = in_RDI;
  if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): allocating dma memory via huge page\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x39,
            "memory_allocate_dma");
    if ((local_18 & 0x1fffff) != 0) {
      local_18 = ((local_18 >> 0x15) + 1) * 0x200000;
    }
    if (((local_19 & 1) != 0) && (0x200000 < local_18)) {
      fprintf(_stderr,"[ERROR] %s:%d %s(): could not map physically contiguous memory\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x42,
              "memory_allocate_dma");
      abort();
    }
    LOCK();
    UNLOCK();
    local_24c = huge_pg_id;
    huge_pg_id = huge_pg_id + 1;
    uVar2 = getpid();
    snprintf(local_1258,0x1000,"/mnt/huge/ixy-%d-%d",(ulong)uVar2,(ulong)local_24c);
    local_125c = open(local_1258,0x42,0x1c0);
    virt = (void *)(long)local_125c;
    local_1268 = virt;
    if (virt == (void *)0xffffffffffffffff) {
      piVar4 = __errno_location();
      local_126c = *piVar4;
      __xpg_strerror_r(local_126c,local_1478,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x49,
              "memory_allocate_dma","open hugetlbfs file, check that /mnt/huge is mounted",
              local_1478);
      exit(local_126c);
    }
    iVar3 = ftruncate(local_125c,local_18);
    local_1488 = (long)iVar3;
    if (local_1488 == -1) {
      piVar4 = __errno_location();
      local_148c = *piVar4;
      __xpg_strerror_r(local_148c,local_1698,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x4a,
              "memory_allocate_dma","allocate huge page memory, check hugetlbfs configuration",
              local_1698);
      exit(local_148c);
    }
    __addr = mmap((void *)0x0,local_18,3,0x40001,local_125c,0);
    if (__addr == (void *)0xffffffffffffffff) {
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      __xpg_strerror_r(iVar3,local_18b8,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x4b,
              "memory_allocate_dma","mmap hugepage",local_18b8);
      exit(iVar3);
    }
    local_18c0 = __addr;
    iVar3 = mlock(__addr,local_18);
    local_18c8 = (long)iVar3;
    if (local_18c8 == -1) {
      piVar4 = __errno_location();
      local_18cc = *piVar4;
      __xpg_strerror_r(local_18cc,local_1ad8,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x4d,
              "memory_allocate_dma","disable swap for DMA memory",local_1ad8);
      exit(local_18cc);
    }
    close(local_125c);
    unlink(local_1258);
    local_10 = __addr;
    local_8 = virt_to_phys(virt);
  }
  else {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): allocating dma memory via VFIO\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x2f,
            "memory_allocate_dma");
    local_240 = mmap((void *)0x0,local_18,3,0x54040021,-1,0);
    local_30 = local_240;
    if (local_240 == (void *)0xffffffffffffffff) {
      piVar4 = __errno_location();
      local_34 = *piVar4;
      __xpg_strerror_r(local_34,local_238,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x30,
              "memory_allocate_dma","mmap hugepage",local_238);
      exit(local_34);
    }
    local_28 = local_240;
    local_8 = vfio_map_dma(in_stack_ffffffffffffe770,in_stack_ffffffffffffe76c);
    local_10 = local_28;
  }
  dVar1.phy = local_8;
  dVar1.virt = local_10;
  return dVar1;
}

Assistant:

struct dma_memory memory_allocate_dma(size_t size, bool require_contiguous) {
	if (VFIO_CONTAINER_FILE_DESCRIPTOR != -1) {
		// VFIO == -1 means that there is no VFIO container set, i.e. VFIO / IOMMU is not activated
		debug("allocating dma memory via VFIO");
		void* virt_addr = (void*) check_err(mmap(NULL, size, PROT_READ | PROT_WRITE, MAP_SHARED | MAP_ANONYMOUS | MAP_HUGETLB | MAP_HUGE_2MB, -1, 0), "mmap hugepage");
		// create IOMMU mapping
		uint64_t iova = (uint64_t) vfio_map_dma(virt_addr, size);
		return (struct dma_memory){
			// for VFIO, this needs to point to the device view memory = IOVA!
			.virt = virt_addr,
			.phy = iova
		};
	} else {
		debug("allocating dma memory via huge page");
		// round up to multiples of 2 MB if necessary, this is the wasteful part
		// this could be fixed by co-locating allocations on the same page until a request would be too large
		// when fixing this: make sure to align on 128 byte boundaries (82599 dma requirement)
		if (size % HUGE_PAGE_SIZE) {
			size = ((size >> HUGE_PAGE_BITS) + 1) << HUGE_PAGE_BITS;
		}
		if (require_contiguous && size > HUGE_PAGE_SIZE) {
			// this is the place to implement larger contiguous physical mappings if that's ever needed
			error("could not map physically contiguous memory");
		}
		// unique filename, C11 stdatomic.h requires a too recent gcc, we want to support gcc 4.8
		uint32_t id = __sync_fetch_and_add(&huge_pg_id, 1);
		char path[PATH_MAX];
		snprintf(path, PATH_MAX, "/mnt/huge/ixy-%d-%d", getpid(), id);
		// temporary file, will be deleted to prevent leaks of persistent pages
		int fd = check_err(open(path, O_CREAT | O_RDWR, S_IRWXU), "open hugetlbfs file, check that /mnt/huge is mounted");
		check_err(ftruncate(fd, (off_t) size), "allocate huge page memory, check hugetlbfs configuration");
		void* virt_addr = (void*) check_err(mmap(NULL, size, PROT_READ | PROT_WRITE, MAP_SHARED | MAP_HUGETLB, fd, 0), "mmap hugepage");
		// never swap out DMA memory
		check_err(mlock(virt_addr, size), "disable swap for DMA memory");
		// don't keep it around in the hugetlbfs
		close(fd);
		unlink(path);
		return (struct dma_memory) {
			.virt = virt_addr,
			.phy = virt_to_phys(virt_addr)
		};
	}
}